

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O2

void __thiscall
FIX::FileLogFactory::FileLogFactory(FileLogFactory *this,string *path,string *backupPath)

{
  *(code **)this = recv;
  std::__cxx11::string::string((string *)(this + 8),(string *)path);
  std::__cxx11::string::string((string *)(this + 0x28),(string *)backupPath);
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x48));
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined4 *)(this + 0xe0) = 0;
  return;
}

Assistant:

FileLogFactory( const std::string& path, const std::string& backupPath )
: m_path( path ), m_backupPath( backupPath ), m_globalLog(0), m_globalLogCount(0) {}